

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void Assimp::ExportSceneFBXA
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  _Rb_tree_header *p_Var1;
  FBXExporter exporter;
  FBXExporter local_c0;
  
  local_c0.binary = false;
  p_Var1 = &local_c0.node_uids._M_t._M_impl.super__Rb_tree_header;
  local_c0.mScene = pScene;
  local_c0.mProperties = pProperties;
  memset(&local_c0.outfile,0,0x88);
  local_c0.node_uids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.last_uid = 999999;
  local_c0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_c0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  FBXExporter::ExportAscii(&local_c0,pFile,pIOSystem);
  std::
  _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_long>,_std::_Select1st<std::pair<const_aiNode_*const,_long>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
  ::~_Rb_tree(&local_c0.node_uids._M_t);
  if (local_c0.material_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.material_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.material_uids.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.material_uids.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_c0.connections)
  ;
  if (local_c0.outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ExportSceneFBXA (
        const char* pFile,
        IOSystem* pIOSystem,
        const aiScene* pScene,
        const ExportProperties* pProperties

    ){
        // initialize the exporter
        FBXExporter exporter(pScene, pProperties);

        // perform ascii export
        exporter.ExportAscii(pFile, pIOSystem);
    }